

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorBase.cpp
# Opt level: O1

void __thiscall
pele::physics::reactions::ReactorBase::set_sundials_solver_tols
          (ReactorBase *this,Context *sunctx,void *sundials_mem,int ncells,Real relTol,Real absTol,
          string *solvername)

{
  ostringstream *poVar1;
  uint length;
  undefined1 auVar2 [16];
  int iVar3;
  N_Vector v;
  realtype *prVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  int flag;
  Print local_1b8;
  long lVar9;
  
  length = ncells * 10;
  v = N_VNew_Serial(length,*(sunctx->sunctx_)._M_t.
                            super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                            ._M_t.
                            super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                            .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
  prVar4 = N_VGetArrayPointer(v);
  if ((this->m_typ_vals)._M_elems[0] <= 0.0) {
    if (0 < this->verbose) {
      local_1b8.os = amrex::OutStream();
      local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
      poVar1 = &local_1b8.ss;
      local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," Setting ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(solvername->_M_dataplus)._M_p,solvername->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," tolerances rtol = ",0x13);
      std::ostream::_M_insert<double>(relTol);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," atol = ",8);
      std::ostream::_M_insert<double>(absTol);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," in PelePhysics \n",0x11);
      amrex::Print::~Print(&local_1b8);
    }
    auVar2 = _DAT_006979c0;
    if (0 < ncells) {
      uVar5 = 1;
      if (1 < (int)length) {
        uVar5 = (ulong)length;
      }
      lVar6 = uVar5 - 1;
      auVar7._8_4_ = (int)lVar6;
      auVar7._0_8_ = lVar6;
      auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
      lVar6 = 0;
      auVar7 = auVar7 ^ _DAT_006979c0;
      auVar8 = _DAT_006979b0;
      do {
        auVar10 = auVar8 ^ auVar2;
        if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                    auVar7._4_4_ < auVar10._4_4_) & 1)) {
          *(Real *)((long)prVar4 + lVar6) = absTol;
        }
        if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
            auVar10._12_4_ <= auVar7._12_4_) {
          *(Real *)((long)prVar4 + lVar6 + 8) = absTol;
        }
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
        lVar6 = lVar6 + 0x10;
      } while ((ulong)((int)uVar5 + 1U & 0xfffffffe) << 3 != lVar6);
    }
  }
  else {
    if (0 < this->verbose) {
      local_1b8.os = amrex::OutStream();
      local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
      poVar1 = &local_1b8.ss;
      local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," Setting ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(solvername->_M_dataplus)._M_p,solvername->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," tolerances with TypVals rtol = ",0x20);
      std::ostream::_M_insert<double>(relTol);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," atolfact = ",0xc);
      std::ostream::_M_insert<double>(absTol);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," in PelePhysics \n",0x11);
      amrex::Print::~Print(&local_1b8);
    }
    if (0 < ncells) {
      uVar5 = 0;
      do {
        lVar6 = 0;
        do {
          prVar4[lVar6] = (this->m_typ_vals)._M_elems[lVar6] * absTol;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 10);
        uVar5 = uVar5 + 1;
        prVar4 = prVar4 + 10;
      } while (uVar5 != (uint)ncells);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)solvername);
  if (iVar3 == 0) {
    local_1b8.rank = CVodeSVtolerances(sundials_mem,relTol,v);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)solvername);
    if (iVar3 == 0) {
      local_1b8.rank = ARKStepSVtolerances(sundials_mem,relTol,v);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)solvername);
      if (iVar3 == 0) {
        local_1b8.rank = ERKStepSVtolerances(sundials_mem,relTol,v);
      }
      else {
        amrex::Abort_host("setSundialsSolverTols not implemented for this solver type");
      }
    }
  }
  iVar3 = utils::check_flag(&local_1b8,"SVtolerances",1);
  if (iVar3 != 0) {
    amrex::Abort_host("Problem in setSundialsSolverTols");
  }
  N_VDestroy(v);
  return;
}

Assistant:

void
ReactorBase::set_sundials_solver_tols(
  // cppcheck-suppress constParameter
  sundials::Context& sunctx,
  void* sundials_mem,
  const int ncells,
  const amrex::Real relTol,
  const amrex::Real absTol,
  const std::string& solvername)
{
  int omp_thread = 0;
#ifdef AMREX_USE_OMP
  omp_thread = omp_get_thread_num();
#endif

  const int neq_tot = (NUM_SPECIES + 1) * ncells;

#if defined(AMREX_USE_CUDA)
  N_Vector atol = N_VNewWithMemHelp_Cuda(
    neq_tot, /*use_managed_mem=*/false,
    *amrex::sundials::The_SUNMemory_Helper(), sunctx);
  amrex::Real* ratol = N_VGetHostArrayPointer_Cuda(atol);
#elif defined(AMREX_USE_HIP)
  N_Vector atol = N_VNewWithMemHelp_Hip(
    neq_tot, /*use_managed_mem=*/false,
    *amrex::sundials::The_SUNMemory_Helper(), sunctx);
  amrex::Real* ratol = N_VGetHostArrayPointer_Hip(atol);
#elif defined(AMREX_USE_DPCPP)
  N_Vector atol = N_VNewWithMemHelp_Sycl(
    neq_tot, /*use_managed_mem=*/false,
    *amrex::sundials::The_SUNMemory_Helper(),
    &amrex::Gpu::Device::streamQueue(), sunctx);
  amrex::Real* ratol = N_VGetHostArrayPointer_Sycl(atol);
#else
  N_Vector atol = N_VNew_Serial(neq_tot, sunctx);
  amrex::Real* ratol = N_VGetArrayPointer(atol);
#endif

  if (m_typ_vals[0] > 0.0) {
    // cppcheck-suppress knownConditionTrueFalse
    if ((verbose > 0) && (omp_thread == 0)) {
      amrex::Print() << " Setting " << solvername
                     << " tolerances with TypVals rtol = " << relTol
                     << " atolfact = " << absTol << " in PelePhysics \n";
    }
    for (int i = 0; i < ncells; i++) {
      const int offset = i * (NUM_SPECIES + 1);
      for (int k = 0; k < NUM_SPECIES + 1; k++) {
        ratol[offset + k] = m_typ_vals[k] * absTol;
      }
    }
  } else {
    // cppcheck-suppress knownConditionTrueFalse
    if ((verbose > 0) && (omp_thread == 0)) {
      amrex::Print() << " Setting " << solvername
                     << " tolerances rtol = " << relTol << " atol = " << absTol
                     << " in PelePhysics \n";
    }
    for (int i = 0; i < neq_tot; i++) {
      ratol[i] = absTol;
    }
  }

#if defined(AMREX_USE_CUDA)
  N_VCopyToDevice_Cuda(atol);
#elif defined(AMREX_USE_HIP)
  N_VCopyToDevice_Hip(atol);
#elif defined(AMREX_USE_DPCPP)
  N_VCopyToDevice_Sycl(atol);
#endif

  // Call CVodeSVtolerances to specify the scalar relative tolerance
  // and vector absolute tolerances
  int flag;
  if (solvername == "cvode") {
    flag = CVodeSVtolerances(sundials_mem, relTol, atol);
  } else if (solvername == "arkstep") {
    flag = ARKStepSVtolerances(sundials_mem, relTol, atol);
  } else if (solvername == "erkstep") {
    flag = ERKStepSVtolerances(sundials_mem, relTol, atol);
  } else {
    amrex::Abort("setSundialsSolverTols not implemented for this solver type");
  }
  if (utils::check_flag(&flag, "SVtolerances", 1) != 0) {
    amrex::Abort("Problem in setSundialsSolverTols");
  }

  N_VDestroy(atol);
}